

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::DeadInsertElimPass::MarkInsertChain
          (DeadInsertElimPass *this,Instruction *insertChain,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *pExtIndices,uint32_t extOffset,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited_phis)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  long lVar2;
  __node_base_ptr *pp_Var3;
  _Hash_node_base *p_Var4;
  __buckets_ptr pp_Var5;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *visited_phis_00;
  bool bVar6;
  uint32_t uVar7;
  Instruction *pIVar8;
  size_type sVar9;
  ulong uVar10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar12;
  uint uVar13;
  ulong uVar14;
  __node_base_ptr *pp_Var15;
  uint32_t objId;
  uint uVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extIndices;
  __hashtable *__h_3;
  __hashtable *__h;
  uint local_b4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a8;
  __node_base_ptr *local_68;
  iterator iStack_60;
  _Hash_node_base *local_58;
  ulong local_50;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_40;
  ulong local_38;
  
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  local_48 = &visited_phis->_M_h;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar7 = 0;
  if (insertChain->has_type_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(insertChain,0);
  }
  pIVar8 = analysis::DefUseManager::GetDef(this_00,uVar7);
  if (pIVar8->opcode_ == OpTypeArray) {
    return;
  }
  if ((insertChain->opcode_ != OpPhi) && (insertChain->opcode_ != OpCompositeInsert)) {
    return;
  }
  local_b0 = pExtIndices;
  local_50 = (ulong)extOffset;
  if ((pExtIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) &&
     (uVar7 = NumComponents(this,pIVar8), uVar7 != 0)) {
    local_68 = (__node_base_ptr *)0x0;
    iStack_60._M_current = (uint32_t *)0x0;
    local_58 = (_Hash_node_base *)0x0;
    local_b4 = 0;
    do {
      if ((__node_base_ptr *)iStack_60._M_current != local_68) {
        iStack_60._M_current = (uint *)local_68;
      }
      if ((_Hash_node_base *)iStack_60._M_current == local_58) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                   &local_b4);
      }
      else {
        *iStack_60._M_current = local_b4;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      local_a8._M_bucket_count = 1;
      local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a8._M_element_count = 0;
      local_a8._M_rehash_policy._M_max_load_factor = 1.0;
      local_a8._M_rehash_policy._M_next_resize = 0;
      local_a8._M_single_bucket = (__node_base_ptr)0x0;
      local_a8._M_buckets = &local_a8._M_single_bucket;
      MarkInsertChain(this,insertChain,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,0,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&local_a8);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_a8);
      local_b4 = local_b4 + 1;
      pp_Var3 = local_68;
      p_Var4 = local_58;
    } while (local_b4 < uVar7);
  }
  else {
    if (insertChain->opcode_ == OpCompositeInsert) {
      local_40 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->liveInserts_;
      local_38 = local_50 & 0xffffffff;
      pvVar12 = local_b0;
      uVar10 = local_50;
      do {
        if (pvVar12 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          uVar7 = 0;
          if (insertChain->has_result_id_ == true) {
            uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_);
          }
          local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
          local_a8._M_buckets = (__buckets_ptr)local_40;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    (local_40,&local_68,&local_a8);
          uVar7 = (insertChain->has_result_id_ & 1) + 1;
          if (insertChain->has_type_id_ == false) {
            uVar7 = (uint)insertChain->has_result_id_;
          }
          uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar7);
          local_a8._M_buckets = &local_a8._M_single_bucket;
          local_a8._M_bucket_count = 1;
          local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_a8._M_element_count = 0;
          local_a8._M_rehash_policy._M_max_load_factor = 1.0;
          local_a8._M_rehash_policy._M_next_resize = 0;
          local_a8._M_single_bucket = (__node_base_ptr)0x0;
          pIVar1 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar1);
          }
          pIVar8 = analysis::DefUseManager::GetDef
                             ((pIVar1->def_use_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                              ._M_head_impl,uVar7);
          MarkInsertChain(this,pIVar8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,0,
                          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&local_a8);
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_a8);
        }
        else {
          bVar6 = ExtInsMatch(pvVar12,insertChain,(uint32_t)uVar10);
          if (bVar6) {
            uVar7 = 0;
            if (insertChain->has_result_id_ == true) {
              uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_)
              ;
            }
            local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
            local_a8._M_buckets = (__buckets_ptr)local_40;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (local_40,&local_68,&local_a8);
            uVar7 = (insertChain->has_result_id_ & 1) + 1;
            if (insertChain->has_type_id_ == false) {
              uVar7 = (uint)insertChain->has_result_id_;
            }
            uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar7);
            local_a8._M_buckets = &local_a8._M_single_bucket;
            local_a8._M_bucket_count = 1;
            local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_a8._M_element_count = 0;
            local_a8._M_rehash_policy._M_max_load_factor = 1.0;
            local_a8._M_rehash_policy._M_next_resize = 0;
            local_a8._M_single_bucket = (__node_base_ptr)0x0;
            pIVar1 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar1);
            }
            pIVar8 = analysis::DefUseManager::GetDef
                               ((pIVar1->def_use_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                ._M_head_impl,uVar7);
            MarkInsertChain(this,pIVar8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,0
                            ,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&local_a8);
            std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_a8);
            break;
          }
          bVar6 = ExtInsConflict(pvVar12,insertChain,(uint32_t)uVar10);
          if (bVar6) {
            uVar7 = 0;
            if (insertChain->has_result_id_ == true) {
              uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_)
              ;
            }
            local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
            local_a8._M_buckets = (__buckets_ptr)local_40;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (local_40,&local_68,&local_a8);
            uVar7 = (insertChain->has_result_id_ & 1) + 1;
            if (insertChain->has_type_id_ == false) {
              uVar7 = (uint)insertChain->has_result_id_;
            }
            uVar13 = ((int)((ulong)((long)(insertChain->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(insertChain->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar7) - 2;
            uVar14 = ((long)(local_b0->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(local_b0->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start >> 2) - local_38;
            uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar7);
            local_a8._M_buckets = &local_a8._M_single_bucket;
            if (uVar13 < uVar14) {
              local_a8._M_bucket_count = 1;
              local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_a8._M_element_count = 0;
              local_a8._M_rehash_policy._M_max_load_factor = 1.0;
              local_a8._M_rehash_policy._M_next_resize = 0;
              local_a8._M_single_bucket = (__node_base_ptr)0x0;
              pIVar1 = (this->super_MemPass).super_Pass.context_;
              if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar1);
              }
              pIVar8 = analysis::DefUseManager::GetDef
                                 ((pIVar1->def_use_mgr_)._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                  .
                                  super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                  ._M_head_impl,uVar7);
              uVar7 = (int)local_50 + uVar13;
              pvVar12 = local_b0;
            }
            else {
              local_a8._M_bucket_count = 1;
              local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              local_a8._M_element_count = 0;
              local_a8._M_rehash_policy._M_max_load_factor = 1.0;
              local_a8._M_rehash_policy._M_next_resize = 0;
              local_a8._M_single_bucket = (__node_base_ptr)0x0;
              pIVar1 = (this->super_MemPass).super_Pass.context_;
              if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar1);
              }
              pIVar8 = analysis::DefUseManager::GetDef
                                 ((pIVar1->def_use_mgr_)._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                  .
                                  super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                  ._M_head_impl,uVar7);
              pvVar12 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              uVar7 = 0;
            }
            MarkInsertChain(this,pIVar8,pvVar12,uVar7,
                            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&local_a8);
            std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_a8);
            pvVar12 = local_b0;
            uVar10 = local_50;
            if (uVar13 < uVar14) break;
          }
        }
        uVar13 = (insertChain->has_result_id_ & 1) + 1;
        if (insertChain->has_type_id_ == false) {
          uVar13 = (uint)insertChain->has_result_id_;
        }
        uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar13 + 1);
        pIVar1 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        insertChain = analysis::DefUseManager::GetDef
                                ((pIVar1->def_use_mgr_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                 ._M_head_impl,uVar7);
      } while (insertChain->opcode_ == OpCompositeInsert);
    }
    if (insertChain->opcode_ != OpPhi) {
      return;
    }
    uVar7 = 0;
    if (insertChain->has_result_id_ == true) {
      uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_);
    }
    local_a8._M_buckets = (__buckets_ptr)CONCAT44(local_a8._M_buckets._4_4_,uVar7);
    sVar9 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(local_48,(key_type_conflict *)&local_a8);
    if (sVar9 != 0) {
      return;
    }
    uVar7 = 0;
    if (insertChain->has_result_id_ == true) {
      uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_);
    }
    local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
    local_a8._M_buckets = (__buckets_ptr)local_48;
    std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_48,&local_68,&local_a8);
    local_a8._M_buckets = (__node_base_ptr *)0x0;
    local_a8._M_bucket_count = 0;
    local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uVar13 = (insertChain->has_result_id_ & 1) + 1;
    if (insertChain->has_type_id_ == false) {
      uVar13 = (uint)insertChain->has_result_id_;
    }
    if (uVar13 != (int)((ulong)((long)(insertChain->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(insertChain->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555)
    {
      uVar16 = 0;
      do {
        uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar13 + uVar16);
        local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
        if ((_Hash_node_base *)local_a8._M_bucket_count == local_a8._M_before_begin._M_nxt) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
                     (iterator)local_a8._M_bucket_count,(uint *)&local_68);
        }
        else {
          *(uint32_t *)local_a8._M_bucket_count = uVar7;
          local_a8._M_bucket_count = local_a8._M_bucket_count + 4;
        }
        uVar16 = uVar16 + 2;
        uVar13 = (insertChain->has_result_id_ & 1) + 1;
        if (insertChain->has_type_id_ == false) {
          uVar13 = (uint)insertChain->has_result_id_;
        }
      } while (uVar16 < (int)((ulong)((long)(insertChain->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(insertChain->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555 - uVar13);
    }
    sVar9 = local_a8._M_bucket_count;
    pp_Var5 = local_a8._M_buckets;
    if (local_a8._M_buckets != (__buckets_ptr)local_a8._M_bucket_count) {
      uVar10 = (long)(local_a8._M_bucket_count - (long)local_a8._M_buckets) >> 2;
      lVar2 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_a8._M_buckets,local_a8._M_bucket_count,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pp_Var5,sVar9);
    }
    _Var11 = std::
             __unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (local_a8._M_buckets,local_a8._M_bucket_count);
    visited_phis_00 = local_48;
    uVar10 = local_50;
    for (pp_Var15 = local_a8._M_buckets; pp_Var3 = local_a8._M_buckets,
        p_Var4 = local_a8._M_before_begin._M_nxt, pp_Var15 != (__node_base_ptr *)_Var11._M_current;
        pp_Var15 = (__node_base_ptr *)((long)pp_Var15 + 4)) {
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      pIVar8 = analysis::DefUseManager::GetDef
                         ((pIVar1->def_use_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                          _M_head_impl,*(uint32_t *)pp_Var15);
      MarkInsertChain(this,pIVar8,local_b0,(uint32_t)uVar10,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)visited_phis_00);
    }
  }
  if (pp_Var3 != (__node_base_ptr *)0x0) {
    operator_delete(pp_Var3,(long)p_Var4 - (long)pp_Var3);
  }
  return;
}

Assistant:

void DeadInsertElimPass::MarkInsertChain(
    Instruction* insertChain, std::vector<uint32_t>* pExtIndices,
    uint32_t extOffset, std::unordered_set<uint32_t>* visited_phis) {
  // Not currently optimizing array inserts.
  Instruction* typeInst = get_def_use_mgr()->GetDef(insertChain->type_id());
  if (typeInst->opcode() == spv::Op::OpTypeArray) return;
  // Insert chains are only composed of inserts and phis
  if (insertChain->opcode() != spv::Op::OpCompositeInsert &&
      insertChain->opcode() != spv::Op::OpPhi)
    return;
  // If extract indices are empty, mark all subcomponents if type
  // is constant length.
  if (pExtIndices == nullptr) {
    uint32_t cnum = NumComponents(typeInst);
    if (cnum > 0) {
      std::vector<uint32_t> extIndices;
      for (uint32_t i = 0; i < cnum; i++) {
        extIndices.clear();
        extIndices.push_back(i);
        std::unordered_set<uint32_t> sub_visited_phis;
        MarkInsertChain(insertChain, &extIndices, 0, &sub_visited_phis);
      }
      return;
    }
  }
  Instruction* insInst = insertChain;
  while (insInst->opcode() == spv::Op::OpCompositeInsert) {
    // If no extract indices, mark insert and inserted object (which might
    // also be an insert chain) and continue up the chain though the input
    // composite.
    //
    // Note: We mark inserted objects in this function (rather than in
    // EliminateDeadInsertsOnePass) because in some cases, we can do it
    // more accurately here.
    if (pExtIndices == nullptr) {
      liveInserts_.insert(insInst->result_id());
      uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
      std::unordered_set<uint32_t> obj_visited_phis;
      MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                      &obj_visited_phis);
    // If extract indices match insert, we are done. Mark insert and
    // inserted object.
    } else if (ExtInsMatch(*pExtIndices, insInst, extOffset)) {
      liveInserts_.insert(insInst->result_id());
      uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
      std::unordered_set<uint32_t> obj_visited_phis;
      MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                      &obj_visited_phis);
      break;
    // If non-matching intersection, mark insert
    } else if (ExtInsConflict(*pExtIndices, insInst, extOffset)) {
      liveInserts_.insert(insInst->result_id());
      // If more extract indices than insert, we are done. Use remaining
      // extract indices to mark inserted object.
      uint32_t numInsertIndices = insInst->NumInOperands() - 2;
      if (pExtIndices->size() - extOffset > numInsertIndices) {
        uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
        std::unordered_set<uint32_t> obj_visited_phis;
        MarkInsertChain(get_def_use_mgr()->GetDef(objId), pExtIndices,
                        extOffset + numInsertIndices, &obj_visited_phis);
        break;
      // If fewer extract indices than insert, also mark inserted object and
      // continue up chain.
      } else {
        uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
        std::unordered_set<uint32_t> obj_visited_phis;
        MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                        &obj_visited_phis);
      }
    }
    // Get next insert in chain
    const uint32_t compId =
        insInst->GetSingleWordInOperand(kInsertCompositeIdInIdx);
    insInst = get_def_use_mgr()->GetDef(compId);
  }
  // If insert chain ended with phi, do recursive call on each operand
  if (insInst->opcode() != spv::Op::OpPhi) return;
  // Mark phi visited to prevent potential infinite loop. If phi is already
  // visited, return to avoid infinite loop.
  if (visited_phis->count(insInst->result_id()) != 0) return;
  visited_phis->insert(insInst->result_id());

  // Phis may have duplicate inputs values for different edges, prune incoming
  // ids lists before recursing.
  std::vector<uint32_t> ids;
  for (uint32_t i = 0; i < insInst->NumInOperands(); i += 2) {
    ids.push_back(insInst->GetSingleWordInOperand(i));
  }
  std::sort(ids.begin(), ids.end());
  auto new_end = std::unique(ids.begin(), ids.end());
  for (auto id_iter = ids.begin(); id_iter != new_end; ++id_iter) {
    Instruction* pi = get_def_use_mgr()->GetDef(*id_iter);
    MarkInsertChain(pi, pExtIndices, extOffset, visited_phis);
  }
}